

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

_Bool has_normative_scaler_ssse3(int src_width,int src_height,int dst_width,int dst_height)

{
  bool local_13;
  _Bool local_12;
  _Bool has_normative_scaler;
  int dst_height_local;
  int dst_width_local;
  int src_height_local;
  int src_width_local;
  
  if ((((dst_width << 1 != src_width) || (local_12 = true, dst_height << 1 != src_height)) &&
      ((dst_width << 2 != src_width || (local_12 = true, dst_height << 2 != src_height)))) &&
     ((dst_width << 2 != src_width * 3 || (local_12 = true, dst_height << 2 != src_height * 3)))) {
    local_13 = dst_width == src_width * 2 && dst_height == src_height * 2;
    local_12 = local_13;
  }
  return local_12;
}

Assistant:

static inline bool has_normative_scaler_ssse3(const int src_width,
                                              const int src_height,
                                              const int dst_width,
                                              const int dst_height) {
  const bool has_normative_scaler =
      (2 * dst_width == src_width && 2 * dst_height == src_height) ||
      (4 * dst_width == src_width && 4 * dst_height == src_height) ||
      (4 * dst_width == 3 * src_width && 4 * dst_height == 3 * src_height) ||
      (dst_width == src_width * 2 && dst_height == src_height * 2);

  return has_normative_scaler;
}